

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

void __thiscall icu_63::SimpleTimeZone::deleteTransitionRules(SimpleTimeZone *this)

{
  if (this->initialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->initialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if (this->firstTransition != (TimeZoneTransition *)0x0) {
    (*(this->firstTransition->super_UObject)._vptr_UObject[1])();
  }
  if (this->stdRule != (AnnualTimeZoneRule *)0x0) {
    (*(this->stdRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if (this->dstRule != (AnnualTimeZoneRule *)0x0) {
    (*(this->dstRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  this->transitionRulesInitialized = '\0';
  this->stdRule = (AnnualTimeZoneRule *)0x0;
  this->dstRule = (AnnualTimeZoneRule *)0x0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTransition = (TimeZoneTransition *)0x0;
  return;
}

Assistant:

void
SimpleTimeZone::deleteTransitionRules(void) {
    if (initialRule != NULL) {
        delete initialRule;
    }
    if (firstTransition != NULL) {
        delete firstTransition;
    }
    if (stdRule != NULL) {
        delete stdRule;
    }
    if (dstRule != NULL) {
        delete dstRule;
    }
    clearTransitionRules();
 }